

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  undefined8 *puVar1;
  bool bVar2;
  int n;
  uint uVar3;
  int iVar4;
  ImU32 IVar5;
  long lVar6;
  ImGuiPayload *pIVar7;
  ImGuiPayload *pIVar8;
  uint uVar9;
  ulong uVar10;
  char *p;
  ImVec4 *buf_00;
  ImGuiWindow *pIVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint flags_00;
  float *p_data;
  uint uVar15;
  uint *p_data_00;
  char **ppcVar17;
  ImGuiContext *pIVar18;
  bool bVar19;
  ImVec2 IVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float f [4];
  int i [4];
  char buf [64];
  float local_138 [5];
  float local_124;
  ImGuiWindow *local_120;
  float local_114;
  float local_110;
  float local_10c;
  uint local_108;
  uint uStack_104;
  undefined8 local_100;
  ulong local_f0;
  ImVec2 local_e8;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float *local_c8;
  char *local_c0;
  uint local_b4;
  uint local_b0;
  float local_ac;
  ImGuiWindow *local_a8;
  ImGuiContext *local_a0;
  char *local_98;
  ulong local_90;
  long local_88;
  long local_80;
  ImVec4 local_78 [4];
  ImVec2 local_38;
  uint uVar16;
  
  pIVar18 = GImGui;
  pIVar11 = GImGui->CurrentWindow;
  pIVar11->WriteAccessed = true;
  if (pIVar11->SkipItems == false) {
    local_dc = GetFrameHeight();
    local_d4 = CalcItemWidth();
    local_124 = 0.0;
    if ((flags & 0x10U) == 0) {
      local_124 = (pIVar18->Style).ItemInnerSpacing.x + local_dc;
    }
    local_c0 = FindRenderedTextEnd(label,(char *)0x0);
    (pIVar18->NextItemData).Flags = 0;
    BeginGroup();
    PushID(label);
    flags_00 = flags & 0xff8ffff7U | 0x100008;
    if ((flags & 0x20U) == 0) {
      flags_00 = flags;
    }
    if ((flags_00 & 8) == 0) {
      ColorEditOptionsPopup(col,flags_00);
    }
    if ((flags_00 & 0x700000) == 0) {
      flags_00 = flags_00 | pIVar18->ColorEditOptions & 0x700000U;
    }
    if ((flags_00 & 0x1800000) == 0) {
      flags_00 = flags_00 | pIVar18->ColorEditOptions & 0x1800000U;
    }
    if ((flags_00 & 0x6000000) == 0) {
      flags_00 = flags_00 | pIVar18->ColorEditOptions & 0x6000000U;
    }
    if ((flags_00 & 0x18000000) == 0) {
      flags_00 = flags_00 | pIVar18->ColorEditOptions & 0x18000000U;
    }
    uVar3 = (flags_00 & 0x700000) - 1;
    if ((flags_00 & 0x700000 ^ uVar3) <= uVar3) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_DisplayMask_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                    ,0x1301,"bool ImGui::ColorEdit4(const char *, float *, ImGuiColorEditFlags)");
    }
    uVar3 = (flags_00 & 0x18000000) - 1;
    local_b4 = flags;
    local_a8 = pIVar11;
    if ((flags_00 & 0x18000000 ^ uVar3) <= uVar3) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                    ,0x1302,"bool ImGui::ColorEdit4(const char *, float *, ImGuiColorEditFlags)");
    }
    uVar3 = pIVar18->ColorEditOptions & 0xe00fffffU | flags_00;
    local_138[0] = *col;
    local_138[1] = col[1];
    local_138[2] = col[2];
    if ((uVar3 & 2) == 0) {
      local_138[3] = col[3];
    }
    else {
      local_138[3] = 1.0;
    }
    local_b0 = flags_00 & 0x10100000;
    if (local_b0 == 0x10100000) {
      ColorConvertHSVtoRGB
                (local_138[0],local_138[1],local_138[2],local_138,local_138 + 1,local_138 + 2);
    }
    else if ((~flags_00 & 0x8200000) == 0) {
      ColorConvertRGBtoHSV
                (local_138[0],local_138[1],local_138[2],local_138,local_138 + 1,local_138 + 2);
      ColorEditRestoreHS(col,local_138,local_138 + 1,local_138 + 2);
    }
    pIVar11 = local_a8;
    uVar9 = (uint)(local_138[0] * 255.0 +
                  (float)(~-(uint)(0.0 <= local_138[0]) & 0xbf000000 |
                         -(uint)(0.0 <= local_138[0]) & 0x3f000000));
    uVar13 = (uint)(local_138[1] * 255.0 +
                   (float)(~-(uint)(0.0 <= local_138[1]) & 0xbf000000 |
                          -(uint)(0.0 <= local_138[1]) & 0x3f000000));
    uVar14 = (uint)(local_138[2] * 255.0 +
                   (float)(~-(uint)(0.0 <= local_138[2]) & 0xbf000000 |
                          -(uint)(0.0 <= local_138[2]) & 0x3f000000));
    _local_108 = CONCAT44(uVar13,uVar9);
    local_100 = CONCAT44((int)(local_138[3] * 255.0 +
                              (float)(~-(uint)(0.0 <= local_138[3]) & 0xbf000000 |
                                     -(uint)(0.0 <= local_138[3]) & 0x3f000000)),uVar14);
    local_110 = (local_a8->DC).CursorPos.x;
    fVar22 = local_124;
    if ((pIVar18->Style).ColorButtonPosition != 0) {
      fVar22 = 0.0;
    }
    local_114 = local_d4 - local_124;
    uVar16 = (uint)((uVar3 & 2) == 0);
    uVar15 = uVar16 + 3;
    local_90 = (ulong)uVar15;
    local_d8 = (local_a8->DC).CursorPos.y;
    (local_a8->DC).CursorPos.x = fVar22 + local_110;
    if (((flags_00 & 0x300000) == 0) || ((uVar3 & 0x20) != 0)) {
      local_f0 = 0;
      if ((flags_00 >> 0x16 & 1) == 0) {
        bVar19 = false;
      }
      else {
        bVar19 = false;
        if ((uVar3 & 0x20) == 0) {
          if (0xfe < (int)uVar9) {
            uVar9 = 0xff;
          }
          uVar10 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar10 = 0;
          }
          if (0xfe < (int)uVar13) {
            uVar13 = 0xff;
          }
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          if (0xfe < (int)uVar14) {
            uVar14 = 0xff;
          }
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          if ((uVar3 & 2) == 0) {
            pcVar12 = "#%02X%02X%02X%02X";
          }
          else {
            pcVar12 = "#%02X%02X%02X";
          }
          ImFormatString((char *)local_78,0x40,pcVar12,uVar10,(ulong)uVar13,(ulong)uVar14);
          SetNextItemWidth(local_114);
          local_e8.x = 0.0;
          local_e8.y = 0.0;
          bVar19 = false;
          buf_00 = local_78;
          bVar2 = InputTextEx("##Text",(char *)0x0,(char *)buf_00,0x40,&local_e8,6,
                              (ImGuiInputTextCallback)0x0,(void *)0x0);
          if (bVar2) {
            while (((ulong)*(byte *)&buf_00->x < 0x24 &&
                   ((0x900000200U >> ((ulong)*(byte *)&buf_00->x & 0x3f) & 1) != 0))) {
              buf_00 = (ImVec4 *)((long)&buf_00->x + 1);
            }
            local_100 = 0xff00000000;
            _local_108 = 0;
            if ((uVar3 & 2) == 0) {
              __isoc99_sscanf(buf_00,"%02X%02X%02X%02X",&local_108,&uStack_104,&local_100,
                              (long)&local_100 + 4);
            }
            else {
              __isoc99_sscanf(buf_00,"%02X%02X%02X",&local_108,&uStack_104,&local_100,
                              (long)&local_100 + 4);
            }
            bVar19 = true;
          }
          if ((uVar3 & 8) == 0) {
            OpenPopupOnItemClick("context",1);
          }
          local_f0 = 0;
        }
      }
    }
    else {
      local_a0 = pIVar18;
      fVar22 = (pIVar18->Style).ItemInnerSpacing.x;
      pcVar12 = "M:0.000";
      if ((flags_00 >> 0x18 & 1) == 0) {
        pcVar12 = "M:000";
      }
      local_c8 = col;
      local_98 = label;
      IVar20 = CalcTextSize(pcVar12,(char *)0x0,false,-1.0);
      local_120 = (ImGuiWindow *)CONCAT44(local_120._4_4_,flags_00);
      iVar4 = ((flags_00 >> 0x15 & 1) != 0) + 1;
      bVar19 = (uVar3 >> 0x13 & 1) != 0;
      fVar21 = (float)(uVar16 + 2);
      fVar23 = (float)(int)((local_114 - fVar22 * fVar21) / (float)uVar15);
      local_cc = 1.0;
      if (1.0 <= fVar23) {
        local_cc = fVar23;
      }
      fVar22 = (float)(int)(local_114 - (fVar22 + local_cc) * fVar21);
      local_d0 = 1.0;
      if (bVar19) {
        local_d0 = 0.0;
      }
      local_ac = 3.57331e-43;
      if (bVar19) {
        local_ac = 0.0;
      }
      local_10c = 1.0;
      if (1.0 <= fVar22) {
        local_10c = fVar22;
      }
      if (local_cc <= IVar20.x) {
        iVar4 = 0;
      }
      local_80 = (long)ColorEdit4::fmt_table_int[0] + (ulong)(uint)(iVar4 << 5);
      local_88 = (long)ColorEdit4::fmt_table_float[0] + (ulong)(uint)(iVar4 << 5);
      p_data_00 = &local_108;
      ppcVar17 = ColorEdit4::ids;
      p_data = local_138;
      bVar19 = false;
      local_f0 = 0;
      uVar10 = 1;
      do {
        if (uVar10 != 1) {
          SameLine(0.0,(local_a0->Style).ItemInnerSpacing.x);
        }
        fVar22 = local_cc;
        if (uVar15 <= uVar10) {
          fVar22 = local_10c;
        }
        SetNextItemWidth(fVar22);
        if (((uint)local_120 >> 0x18 & 1) == 0) {
          local_78[0]._0_8_ = (ulong)(uint)local_78[0].y << 0x20;
          local_e8.x = local_ac;
          bVar2 = DragScalar(*ppcVar17,4,p_data_00,1.0,local_78,&local_e8,
                             *(char **)(local_80 + -8 + uVar10 * 8),0);
          bVar19 = (bool)(bVar19 | bVar2);
        }
        else {
          local_78[0]._0_8_ = (ulong)(uint)local_78[0].y << 0x20;
          local_e8.x = local_d0;
          bVar2 = DragScalar(*ppcVar17,8,p_data,0.003921569,local_78,&local_e8,
                             *(char **)(local_88 + -8 + uVar10 * 8),0);
          bVar19 = (bool)(bVar19 | bVar2);
          local_f0 = CONCAT71((int7)(local_f0 >> 8),(byte)local_f0 | bVar19);
        }
        if ((uVar3 & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
        p_data_00 = p_data_00 + 1;
        ppcVar17 = ppcVar17 + 1;
        p_data = p_data + 1;
        bVar2 = uVar10 != uVar15;
        uVar10 = uVar10 + 1;
      } while (bVar2);
      label = local_98;
      pIVar11 = local_a8;
      col = local_c8;
      pIVar18 = local_a0;
      flags_00 = (uint)local_120;
    }
    if ((uVar3 & 0x10) == 0) {
      fVar22 = 0.0;
      if (((uVar3 & 0x20) == 0) && ((pIVar18->Style).ColorButtonPosition != 0)) {
        fVar22 = local_114 + (pIVar18->Style).ItemInnerSpacing.x;
      }
      (pIVar11->DC).CursorPos.x = fVar22 + local_110;
      (pIVar11->DC).CursorPos.y = local_d8;
      local_78[0]._0_8_ = *(undefined8 *)col;
      local_78[0].z = col[2];
      if ((uVar3 & 2) == 0) {
        local_78[0].w = col[3];
      }
      else {
        local_78[0].w = 1.0;
      }
      bVar2 = ColorButton("##ColorButton",local_78,uVar3,(ImVec2)0x0);
      if ((uVar3 & 4) == 0 && bVar2) {
        (pIVar18->ColorPickerRef).x = local_78[0].x;
        (pIVar18->ColorPickerRef).y = local_78[0].y;
        (pIVar18->ColorPickerRef).z = local_78[0].z;
        (pIVar18->ColorPickerRef).w = local_78[0].w;
        OpenPopup("picker",0);
        local_e8.x = (pIVar18->LastItemData).Rect.Min.x + 0.0;
        local_e8.y = (pIVar18->LastItemData).Rect.Max.y + (pIVar18->Style).ItemSpacing.y;
        local_38.x = 0.0;
        local_38.y = 0.0;
        SetNextWindowPos(&local_e8,0,&local_38);
      }
      if ((uVar3 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_120 = (ImGuiWindow *)0x0;
      bVar2 = BeginPopup("picker",0);
      pcVar12 = local_c0;
      if (bVar2) {
        local_120 = pIVar18->CurrentWindow;
        local_c8 = col;
        if (local_c0 != label) {
          TextEx(label,local_c0,0);
          Spacing();
        }
        uVar13 = local_b4 & 0x1f890002;
        SetNextItemWidth(local_dc * 12.0);
        bVar2 = ColorPicker4("##picker",local_c8,uVar13 | 0x740080,&(pIVar18->ColorPickerRef).x);
        bVar19 = (bool)(bVar19 | bVar2);
        EndPopup();
        col = local_c8;
      }
    }
    else {
      local_120 = (ImGuiWindow *)0x0;
      pcVar12 = local_c0;
    }
    if ((pcVar12 != label) && ((uVar3 & 0x80) == 0)) {
      if ((uVar3 & 0x20) == 0) {
        local_124 = local_d4 + (pIVar18->Style).ItemInnerSpacing.x;
      }
      fVar22 = (pIVar18->Style).FramePadding.y;
      (pIVar11->DC).CursorPos.x = local_110 + local_124;
      (pIVar11->DC).CursorPos.y = local_d8 + fVar22;
      TextEx(label,pcVar12,0);
    }
    pIVar11 = local_120;
    if ((bVar19 != false) && (local_120 == (ImGuiWindow *)0x0)) {
      if ((local_f0 & 1) == 0) {
        lVar6 = 0;
        do {
          local_138[lVar6] = (float)(int)(&local_108)[lVar6] / 255.0;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
      }
      if ((~flags_00 & 0x8200000) == 0) {
        pIVar18->ColorEditLastHue = local_138[0];
        pIVar18->ColorEditLastSat = local_138[1];
        ColorConvertHSVtoRGB
                  (local_138[0],local_138[1],local_138[2],local_138,local_138 + 1,local_138 + 2);
        pIVar11 = local_120;
        local_78[0]._0_8_ = CONCAT44(local_138[1],local_138[0]);
        local_78[0].z = local_138[2];
        local_78[0].w = 0.0;
        IVar5 = ColorConvertFloat4ToU32(local_78);
        pIVar18->ColorEditLastColor = IVar5;
      }
      if (local_b0 == 0x10100000) {
        ColorConvertRGBtoHSV
                  (local_138[0],local_138[1],local_138[2],local_138,local_138 + 1,local_138 + 2);
      }
      *col = local_138[0];
      col[1] = local_138[1];
      col[2] = local_138[2];
      if ((uVar3 & 2) == 0) {
        col[3] = local_138[3];
      }
    }
    PopID();
    EndGroup();
    if (((((pIVar18->LastItemData).StatusFlags & 1) != 0) && ((uVar3 & 0x200) == 0)) &&
       (bVar2 = BeginDragDropTarget(), bVar2)) {
      pIVar7 = AcceptDragDropPayload("_COL3F",0);
      if (pIVar7 != (ImGuiPayload *)0x0) {
        puVar1 = (undefined8 *)pIVar7->Data;
        col[2] = *(float *)(puVar1 + 1);
        *(undefined8 *)col = *puVar1;
        bVar19 = true;
      }
      pIVar8 = AcceptDragDropPayload("_COL4F",0);
      if (pIVar8 != (ImGuiPayload *)0x0) {
        memcpy(col,pIVar8->Data,(ulong)(uint)((int)local_90 << 2));
        bVar19 = true;
      }
      if ((pIVar8 != (ImGuiPayload *)0x0 || pIVar7 != (ImGuiPayload *)0x0) &&
          (flags_00 >> 0x1c & 1) != 0) {
        ColorConvertRGBtoHSV(*col,col[1],col[2],col,col + 1,col + 2);
      }
      EndDragDropTarget();
      pIVar11 = local_120;
    }
    if (((pIVar11 != (ImGuiWindow *)0x0) && (pIVar18->ActiveId != 0)) &&
       (pIVar18->ActiveIdWindow == pIVar11)) {
      (pIVar18->LastItemData).ID = pIVar18->ActiveId;
    }
    if (bVar19 != false) {
      MarkItemEdited((pIVar18->LastItemData).ID);
    }
  }
  else {
    bVar19 = false;
  }
  return bVar19;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}